

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wining-hand-collator.cpp
# Opt level: O2

void __thiscall
mahjong::WiningHandCollator::backtrackTripletOrQuad
          (WiningHandCollator *this,WiningHand *extended_hand,TileHolder *extended_holder)

{
  bool bVar1;
  Meld meld;
  
  TileHolder::popTripletOrQuadWithFrontTile(&meld,extended_holder);
  bVar1 = Meld::isValid(&meld);
  if ((bVar1) &&
     ((ulong)(((long)(extended_hand->pairs).
                     super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(extended_hand->pairs).
                    super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18) < 2)) {
    std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::push_back
              (&extended_hand->melds,&meld);
    backtrack(this,extended_hand,extended_holder);
  }
  std::_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~_Vector_base
            ((_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&meld);
  return;
}

Assistant:

void WiningHandCollator::backtrackTripletOrQuad(WiningHand extended_hand, TileHolder extended_holder)
{
	auto meld = extended_holder.popTripletOrQuadWithFrontTile();
	if (meld.isValid() && extended_hand.pairs.size() < 2)
	{
		extended_hand.melds.push_back(meld);
		backtrack(extended_hand, extended_holder);
	}
}